

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::FunctionExp(SQCompiler *this,SQInteger ftype,bool lambda)

{
  SQFuncState *this_00;
  SQInteger arg0;
  SQUnsignedInteger SVar1;
  SQObject SVar2;
  undefined1 local_40 [8];
  SQObjectPtr dummy;
  bool lambda_local;
  SQInteger ftype_local;
  SQCompiler *this_local;
  
  Lex(this);
  SVar2 = Expect(this,0x28);
  dummy.super_SQObject._unVal.fFloat = (SQFloat)SVar2._type;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_40);
  CreateFunction(this,(SQObject *)local_40,lambda);
  this_00 = this->_fs;
  arg0 = SQFuncState::PushTarget(this_00,-1);
  SVar1 = sqvector<SQObjectPtr>::size(&this->_fs->_functions);
  SQFuncState::AddInstruction(this_00,_OP_CLOSURE,arg0,SVar1 - 1,(ulong)(ftype != 0x11d),0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_40);
  return;
}

Assistant:

void FunctionExp(SQInteger ftype,bool lambda = false)
    {
        Lex(); Expect(_SC('('));
        SQObjectPtr dummy;
        CreateFunction(dummy,lambda);
        _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, ftype == TK_FUNCTION?0:1);
    }